

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O0

void emtslbl(emtcxdef *ctx,uint *lblp,int release)

{
  ushort uVar1;
  ushort *puVar2;
  int in_EDX;
  uint *in_RSI;
  long in_RDI;
  ushort curpos;
  short diff;
  ushort nxt;
  emtldef *fwdp;
  uint fwd;
  emtldef *p;
  uint lbl;
  undefined2 in_stack_ffffffffffffffc8;
  ushort uVar3;
  short in_stack_ffffffffffffffcc;
  ushort in_stack_ffffffffffffffce;
  emtcxdef *in_stack_ffffffffffffffd0;
  uint local_24;
  
  puVar2 = (ushort *)(in_RDI + 0x26 + (ulong)*in_RSI * 6);
  uVar3 = *(ushort *)(in_RDI + 0x12);
  puVar2[1] = uVar3;
  *(byte *)(puVar2 + 2) = (byte)puVar2[2] | 1;
  uVar1 = *puVar2;
  while (local_24 = (uint)uVar1, local_24 != 0xffff) {
    in_stack_ffffffffffffffd0 = (emtcxdef *)(in_RDI + 0x26 + (ulong)local_24 * 6);
    in_stack_ffffffffffffffce = *(ushort *)&in_stack_ffffffffffffffd0->emtcxerr;
    in_stack_ffffffffffffffcc = uVar3 - *(short *)((long)&in_stack_ffffffffffffffd0->emtcxerr + 2);
    oswp2((void *)(*(long *)(in_RDI + 0x18) +
                  (long)(int)(uint)*(ushort *)((long)&in_stack_ffffffffffffffd0->emtcxerr + 2)),
          (int)in_stack_ffffffffffffffcc);
    *(undefined2 *)&in_stack_ffffffffffffffd0->emtcxerr = 0xffff;
    emtdlbl(in_stack_ffffffffffffffd0,
            (uint *)CONCAT26(in_stack_ffffffffffffffce,
                             CONCAT24(in_stack_ffffffffffffffcc,
                                      CONCAT22(uVar3,in_stack_ffffffffffffffc8))));
    uVar1 = in_stack_ffffffffffffffce;
  }
  *puVar2 = 0xffff;
  if (in_EDX != 0) {
    emtdlbl(in_stack_ffffffffffffffd0,
            (uint *)CONCAT26(in_stack_ffffffffffffffce,
                             CONCAT24(in_stack_ffffffffffffffcc,
                                      CONCAT22(uVar3,in_stack_ffffffffffffffc8))));
  }
  return;
}

Assistant:

void emtslbl(emtcxdef *ctx, noreg uint *lblp, int release)
{
    uint     lbl = *lblp;
    emtldef *p = &ctx->emtcxlbl[lbl];
    uint     fwd;
    emtldef *fwdp;
    ushort   nxt;
    short    diff;
    ushort   curpos = ctx->emtcxofs;
    
    p->emtlofs = curpos;
    p->emtlflg |= EMTLFSET;
    
    /* run through forward reference list, fixing up each reference */
    for (fwd = p->emtllnk ; fwd != EMTLLNKEND ; fwd = nxt)
    {
        fwdp = &ctx->emtcxlbl[fwd];        /* get pointer to current record */
        nxt = fwdp->emtllnk;                    /* remember the next record */

        /* write the fixup, and release the forward reference */
        diff = curpos - fwdp->emtlofs;
        oswp2(ctx->emtcxptr + fwdp->emtlofs, diff);
        fwdp->emtllnk = EMTLLNKEND;
        emtdlbl(ctx, &fwd);
    }

    p->emtllnk = EMTLLNKEND;    /* there are no more forward refs for label */
    if (release) emtdlbl(ctx, lblp);
}